

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::startThreads(FastText *this)

{
  rep rVar1;
  int64_t iVar2;
  element_type *peVar3;
  pointer *__ptr;
  int iVar4;
  int32_t i;
  long lVar5;
  duration<long,_std::ratio<1L,_1000L>_> local_58;
  thread local_50;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->start_).__d.__r = rVar1;
  iVar4 = 0;
  LOCK();
  (this->tokenCount_).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->loss_)._M_i = -1.0;
  UNLOCK();
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            (&threads,(long)((this->args_).
                             super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                            ->thread);
  for (; iVar4 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->thread; iVar4 = iVar4 + 1) {
    local_50._M_id._M_thread = (id)0;
    local_58.__r = (rep)operator_new(0x18);
    *(undefined ***)local_58.__r = &PTR___State_00143a68;
    *(FastText **)(local_58.__r + 8) = this;
    *(int *)(local_58.__r + 0x10) = iVar4;
    std::thread::_M_start_thread(&local_50,&local_58,0);
    if ((long *)local_58.__r != (long *)0x0) {
      (**(code **)(*(long *)local_58.__r + 8))();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&threads,&local_50);
    std::thread::~thread(&local_50);
  }
  iVar2 = Dictionary::ntokens((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  while (peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr, (this->tokenCount_).super___atomic_base<long>._M_i < peVar3->epoch * iVar2
        ) {
    local_58.__r = 10000;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_58);
    if ((0.0 <= (this->loss_)._M_i) &&
       (1 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            verbose)) {
      lVar5 = (this->tokenCount_).super___atomic_base<long>._M_i;
      iVar4 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->epoch;
      std::operator<<((ostream *)&std::cerr,"\r");
      printInfo(this,(float)lVar5 / (float)(iVar4 * iVar2),(this->loss_)._M_i,(ostream *)&std::cerr)
      ;
    }
  }
  for (lVar5 = 0; lVar5 < peVar3->thread; lVar5 = lVar5 + 1) {
    std::thread::join();
    peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (0 < peVar3->verbose) {
    std::operator<<((ostream *)&std::cerr,"\r");
    printInfo(this,1.0,(this->loss_)._M_i,(ostream *)&std::cerr);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  return;
}

Assistant:

void FastText::startThreads() {
  start_ = std::chrono::steady_clock::now();
  tokenCount_ = 0;
  loss_ = -1;
  std::vector<std::thread> threads;
  threads.reserve(args_->thread);
  for (int32_t i = 0; i < args_->thread; i++) {
    threads.push_back(std::thread([=]() { trainThread(i); }));
  }
  const int64_t ntokens = dict_->ntokens();
  // Same condition as trainThread
  while (tokenCount_ < args_->epoch * ntokens) {
    std::this_thread::sleep_for(std::chrono::milliseconds(10000));
    if (loss_ >= 0 && args_->verbose > 1) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      std::cerr << "\r";
      printInfo(progress, loss_, std::cerr);
    }
  }
  for (int32_t i = 0; i < args_->thread; i++) {
    threads[i].join();
  }
  if (args_->verbose > 0) {
    std::cerr << "\r";
    printInfo(1.0, loss_, std::cerr);
    std::cerr << std::endl;
  }
}